

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void * tcmalloc::MetaDataAlloc(size_t bytes)

{
  void *pvVar1;
  long lVar2;
  void *rv;
  void *ptr;
  size_t real_size;
  intptr_t alignment;
  SpinLockHolder h;
  void *rv_1;
  size_t bytes_local;
  
  if (0x7fffff < bytes) {
    pvVar1 = TCMalloc_SystemAlloc(bytes,(size_t *)0x0,0x40);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    metadata_system_bytes_ = bytes + metadata_system_bytes_;
    return pvVar1;
  }
  SpinLockHolder::SpinLockHolder((SpinLockHolder *)&alignment,(SpinLock *)&metadata_alloc_lock);
  real_size = -(long)metadata_chunk_alloc_ & 0x3f;
  if (metadata_chunk_avail_ < (void *)(bytes + real_size)) {
    pvVar1 = TCMalloc_SystemAlloc(0x800000,(size_t *)&ptr,0x40);
    if (pvVar1 == (void *)0x0) {
      bytes_local = 0;
      goto LAB_0012fe51;
    }
    metadata_chunk_avail_ = ptr;
    real_size = 0;
    metadata_chunk_alloc_ = pvVar1;
  }
  bytes_local = (long)metadata_chunk_alloc_ + real_size;
  lVar2 = real_size + bytes;
  metadata_chunk_alloc_ = (void *)(lVar2 + (long)metadata_chunk_alloc_);
  metadata_chunk_avail_ = (void *)((long)metadata_chunk_avail_ - lVar2);
  metadata_system_bytes_ = lVar2 + metadata_system_bytes_;
LAB_0012fe51:
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&alignment);
  return (void *)bytes_local;
}

Assistant:

void* MetaDataAlloc(size_t bytes) {
  if (bytes >= kMetadataAllocChunkSize) {
    void *rv = TCMalloc_SystemAlloc(bytes,
                                    nullptr, kMetadataAllignment);
    if (rv != nullptr) {
      metadata_system_bytes_ += bytes;
    }
    return rv;
  }

  SpinLockHolder h(&metadata_alloc_lock);

  // the following works by essentially turning address to integer of
  // log_2 kMetadataAllignment size and negating it. I.e. negated
  // value + original value gets 0 and that's what we want modulo
  // kMetadataAllignment. Note, we negate before masking higher bits
  // off, otherwise we'd have to mask them off after negation anyways.
  intptr_t alignment = -reinterpret_cast<intptr_t>(metadata_chunk_alloc_) & (kMetadataAllignment-1);

  if (metadata_chunk_avail_ < bytes + alignment) {
    size_t real_size;
    void *ptr = TCMalloc_SystemAlloc(kMetadataAllocChunkSize,
                                     &real_size, kMetadataAllignment);
    if (ptr == nullptr) {
      return nullptr;
    }

    metadata_chunk_alloc_ = static_cast<char *>(ptr);
    metadata_chunk_avail_ = real_size;

    alignment = 0;
  }

  void *rv = static_cast<void *>(metadata_chunk_alloc_ + alignment);
  bytes += alignment;
  metadata_chunk_alloc_ += bytes;
  metadata_chunk_avail_ -= bytes;
  metadata_system_bytes_ += bytes;
  return rv;
}